

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlc.h
# Opt level: O3

Wlc_Obj_t * Wlc_ObjFanin0(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar2;
  
  if ((pObj->nFanins < 3) && ((*(uint *)pObj & 0x3f | 0x10) != 0x16)) {
    paVar2 = &pObj->field_10;
  }
  else {
    paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
  }
  iVar1 = paVar2->Fanins[0];
  if ((0 < (long)iVar1) && (iVar1 < p->nObjsAlloc)) {
    return p->pObjs + iVar1;
  }
  __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
}

Assistant:

static inline int          Wlc_ObjHasArray( Wlc_Obj_t * p )                         { return p->nFanins > 2 || p->Type == WLC_OBJ_CONST || p->Type == WLC_OBJ_BIT_SELECT; }